

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O2

ngx_int_t ngx_http_index_handler(ngx_http_request_t *r)

{
  ngx_http_core_loc_conf_t *clcf;
  long lVar1;
  ngx_log_t *pnVar2;
  long lVar3;
  ngx_int_t nVar4;
  void *__dest;
  undefined8 uVar5;
  size_t reserved;
  u_char uVar6;
  ngx_str_t *uri_00;
  ngx_http_request_t *pnVar7;
  size_t sVar8;
  u_char *puVar9;
  ngx_open_file_info_t local_1c8;
  undefined1 auStack_158 [8];
  ngx_str_t uri;
  undefined8 *puStack_e8;
  ngx_http_script_engine_t e;
  size_t local_80;
  size_t root;
  long *local_70;
  undefined1 local_68 [8];
  ngx_str_t dir;
  undefined1 local_48 [8];
  ngx_str_t path;
  
  nVar4 = -5;
  if (((r->uri).data[(r->uri).len - 1] == '/') && ((r->method & 0xe) != 0)) {
    local_70 = (long *)r->loc_conf[ngx_http_index_module.ctx_index];
    clcf = (ngx_http_core_loc_conf_t *)r->loc_conf[ngx_http_core_module.ctx_index];
    local_80 = 0;
    path.len = 0;
    lVar1 = *(long *)*local_70;
    uVar5 = CONCAT71((int7)(ngx_http_core_module.ctx_index >> 8),1);
    pnVar7 = (ngx_http_request_t *)0x0;
    root = 0;
    dir.data = (u_char *)0x0;
    do {
      if (*(ngx_http_request_t **)(*local_70 + 8) <= pnVar7) {
        return -5;
      }
      path.data._4_4_ = (uint)uVar5;
      uri_00 = (ngx_str_t *)(lVar1 + (long)pnVar7 * 0x20);
      if (*(long *)(lVar1 + 0x10 + (long)pnVar7 * 0x20) == 0) {
        if (*uri_00->data == '/') goto LAB_0016140f;
        reserved = local_70[1];
        sVar8 = uri_00->len;
      }
      else {
        e._64_8_ = 0;
        e.line.len = 0;
        e.line.data = (u_char *)0x0;
        e.buf.len = 0;
        e.buf.data = (u_char *)0x0;
        e.pos = (u_char *)0x0;
        e.sp = (ngx_http_variable_value_t *)0x0;
        e.ip = (u_char *)0x0;
        puStack_e8 = *(undefined8 **)uri_00[1].len;
        e.args = &DAT_00000001;
        sVar8 = 1;
        e.status = (ngx_int_t)r;
        while ((code *)*puStack_e8 != (code *)0x0) {
          lVar3 = (*(code *)*puStack_e8)(&puStack_e8);
          sVar8 = sVar8 + lVar3;
        }
        reserved = sVar8 + 0x10;
      }
      if (root < reserved) {
        dir.data = ngx_http_map_uri_to_path(r,(ngx_str_t *)local_48,&local_80,reserved);
        if (dir.data == (u_char *)0x0) {
          return -1;
        }
        root = (long)local_48 + (path.len - (long)dir.data);
      }
      puVar9 = dir.data;
      e.request = pnVar7;
      if (uri_00[1].data == (u_char *)0x0) {
        memcpy(dir.data,uri_00->data,uri_00->len);
        local_48 = (undefined1  [8])(puVar9 + ~path.len + uri_00->len);
      }
      else {
        puStack_e8 = *(undefined8 **)uri_00[1].data;
        e.ip = dir.data;
        while ((code *)*puStack_e8 != (code *)0x0) {
          (*(code *)*puStack_e8)(&puStack_e8);
        }
        if (*puVar9 == '/') {
          auStack_158 = (undefined1  [8])(sVar8 - 1);
          uri_00 = (ngx_str_t *)auStack_158;
          uri.len = (size_t)puVar9;
          goto LAB_0016140f;
        }
        local_48 = (undefined1  [8])(e.ip + -path.len);
        *e.ip = '\0';
      }
      pnVar2 = r->connection->log;
      if ((pnVar2->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar2,0,"open index \"%V\"",(ngx_str_t *)local_48);
      }
      local_1c8.disable_symlinks_from = 0;
      local_1c8.failed = (char *)0x0;
      local_1c8.err = 0;
      local_1c8._60_4_ = 0;
      local_1c8.fs_size = 0;
      local_1c8.mtime = 0;
      local_1c8.size = 0;
      local_1c8.fd = 0;
      local_1c8._4_4_ = 0;
      local_1c8.uniq = 0;
      local_1c8.read_ahead = clcf->read_ahead;
      local_1c8.directio = clcf->directio;
      local_1c8.valid = clcf->open_file_cache_valid;
      local_1c8.min_uses = clcf->open_file_cache_min_uses;
      local_1c8._98_6_ = 0;
      local_1c8._96_2_ =
           ((ushort)(int)clcf->open_file_cache_errors & 1) * 0x20 +
           (short)(((uint)clcf->open_file_cache_events & 1) << 6) + 8;
      nVar4 = ngx_http_set_disable_symlinks(r,clcf,(ngx_str_t *)local_48,&local_1c8);
      if (nVar4 != 0) {
        return 500;
      }
      nVar4 = ngx_open_cached_file(clcf->open_file_cache,(ngx_str_t *)local_48,&local_1c8,r->pool);
      if (nVar4 == 0) {
        auStack_158 = (undefined1  [8])((r->uri).len + (sVar8 - 1));
        if (clcf->alias == 0) {
          uri.len = path.len + local_80;
        }
        else {
          __dest = ngx_pnalloc(r->pool,(size_t)auStack_158);
          if (__dest == (void *)0x0) {
            return 500;
          }
          uri.len = (size_t)__dest;
          memcpy(__dest,(r->uri).data,(r->uri).len);
          memcpy((void *)((long)__dest + (r->uri).len),dir.data,sVar8 - 1);
        }
        uri_00 = (ngx_str_t *)auStack_158;
LAB_0016140f:
        nVar4 = ngx_http_internal_redirect(r,uri_00,&r->args);
        return nVar4;
      }
      if (local_1c8.err == 0) goto LAB_00161446;
      pnVar2 = r->connection->log;
      if ((pnVar2->log_level & 0x100) != 0) {
        ngx_log_error_core(8,pnVar2,local_1c8.err,"%s \"%s\" failed",local_1c8.failed,path.len);
      }
      if ((uint)local_1c8.err < 0x29) {
        if ((0x1000102000U >> ((ulong)(uint)local_1c8.err & 0x3f) & 1) != 0) {
          nVar4 = ngx_http_index_error(r,clcf,(u_char *)path.len,local_1c8.err);
          return nVar4;
        }
        if ((0x10080000000U >> ((ulong)(uint)local_1c8.err & 0x3f) & 1) != 0) {
          return 0x193;
        }
      }
      if ((path.data._4_4_ & 1) != 0) {
        if (((u_char *)path.len == dir.data + -1) ||
           (uVar6 = '/', puVar9 = dir.data + -1, dir.data[-1] != '/')) {
          uVar6 = *dir.data;
          puVar9 = dir.data;
        }
        path.data._4_1_ = uVar6;
        *puVar9 = '\0';
        local_68 = (undefined1  [8])((long)puVar9 - path.len);
        dir.len = path.len;
        pnVar2 = r->connection->log;
        if ((pnVar2->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar2,0,"http index check dir: \"%V\"",(ngx_str_t *)local_68);
        }
        uri.data = (u_char *)0x0;
        auStack_158 = (undefined1  [8])0x0;
        uri.len = 0;
        nVar4 = ngx_http_set_disable_symlinks
                          (r,clcf,(ngx_str_t *)local_68,(ngx_open_file_info_t *)auStack_158);
        if (nVar4 != 0) {
          return 500;
        }
        nVar4 = ngx_open_cached_file
                          (clcf->open_file_cache,(ngx_str_t *)local_68,
                           (ngx_open_file_info_t *)auStack_158,r->pool);
        if (nVar4 == 0) {
          *puVar9 = path.data._4_1_;
          pnVar2 = r->connection->log;
          if (1 < pnVar2->log_level) {
            ngx_log_error_core(2,pnVar2,0,"\"%s\" is not a directory",dir.len);
          }
        }
        goto LAB_00161446;
      }
      pnVar7 = (ngx_http_request_t *)((long)&(e.request)->signature + 1);
      uVar5 = 0;
    } while (local_1c8.err == 2);
    pnVar2 = r->connection->log;
    if (2 < pnVar2->log_level) {
      ngx_log_error_core(3,pnVar2,local_1c8.err,"%s \"%s\" failed",local_1c8.failed,path.len);
    }
LAB_00161446:
    nVar4 = 500;
  }
  return nVar4;
}

Assistant:

static ngx_int_t
ngx_http_index_handler(ngx_http_request_t *r)
{
    u_char                       *p, *name;
    size_t                        len, root, reserve, allocated;
    ngx_int_t                     rc;
    ngx_str_t                     path, uri;
    ngx_uint_t                    i, dir_tested;
    ngx_http_index_t             *index;
    ngx_open_file_info_t          of;
    ngx_http_script_code_pt       code;
    ngx_http_script_engine_t      e;
    ngx_http_core_loc_conf_t     *clcf;
    ngx_http_index_loc_conf_t    *ilcf;
    ngx_http_script_len_code_pt   lcode;

    if (r->uri.data[r->uri.len - 1] != '/') {
        return NGX_DECLINED;
    }

    if (!(r->method & (NGX_HTTP_GET|NGX_HTTP_HEAD|NGX_HTTP_POST))) {
        return NGX_DECLINED;
    }

    ilcf = ngx_http_get_module_loc_conf(r, ngx_http_index_module);
    clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

    allocated = 0;
    root = 0;
    dir_tested = 0;
    name = NULL;
    /* suppress MSVC warning */
    path.data = NULL;

    index = ilcf->indices->elts;
    for (i = 0; i < ilcf->indices->nelts; i++) {

        if (index[i].lengths == NULL) {

            if (index[i].name.data[0] == '/') {
                return ngx_http_internal_redirect(r, &index[i].name, &r->args);
            }

            reserve = ilcf->max_index_len;
            len = index[i].name.len;

        } else {
            ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

            e.ip = index[i].lengths->elts;
            e.request = r;
            e.flushed = 1;

            /* 1 is for terminating '\0' as in static names */
            len = 1;

            while (*(uintptr_t *) e.ip) {
                lcode = *(ngx_http_script_len_code_pt *) e.ip;
                len += lcode(&e);
            }

            /* 16 bytes are preallocation */

            reserve = len + 16;
        }

        if (reserve > allocated) {

            name = ngx_http_map_uri_to_path(r, &path, &root, reserve);
            if (name == NULL) {
                return NGX_ERROR;
            }

            allocated = path.data + path.len - name;
        }

        if (index[i].values == NULL) {

            /* index[i].name.len includes the terminating '\0' */

            ngx_memcpy(name, index[i].name.data, index[i].name.len);

            path.len = (name + index[i].name.len - 1) - path.data;

        } else {
            e.ip = index[i].values->elts;
            e.pos = name;

            while (*(uintptr_t *) e.ip) {
                code = *(ngx_http_script_code_pt *) e.ip;
                code((ngx_http_script_engine_t *) &e);
            }

            if (*name == '/') {
                uri.len = len - 1;
                uri.data = name;
                return ngx_http_internal_redirect(r, &uri, &r->args);
            }

            path.len = e.pos - path.data;

            *e.pos = '\0';
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "open index \"%V\"", &path);

        ngx_memzero(&of, sizeof(ngx_open_file_info_t));

        of.read_ahead = clcf->read_ahead;
        of.directio = clcf->directio;
        of.valid = clcf->open_file_cache_valid;
        of.min_uses = clcf->open_file_cache_min_uses;
        of.test_only = 1;
        of.errors = clcf->open_file_cache_errors;
        of.events = clcf->open_file_cache_events;

        if (ngx_http_set_disable_symlinks(r, clcf, &path, &of) != NGX_OK) {
            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        if (ngx_open_cached_file(clcf->open_file_cache, &path, &of, r->pool)
            != NGX_OK)
        {
            if (of.err == 0) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, of.err,
                           "%s \"%s\" failed", of.failed, path.data);

#if (NGX_HAVE_OPENAT)
            if (of.err == NGX_EMLINK
                || of.err == NGX_ELOOP)
            {
                return NGX_HTTP_FORBIDDEN;
            }
#endif

            if (of.err == NGX_ENOTDIR
                || of.err == NGX_ENAMETOOLONG
                || of.err == NGX_EACCES)
            {
                return ngx_http_index_error(r, clcf, path.data, of.err);
            }

            if (!dir_tested) {
                rc = ngx_http_index_test_dir(r, clcf, path.data, name - 1);

                if (rc != NGX_OK) {
                    return rc;
                }

                dir_tested = 1;
            }

            if (of.err == NGX_ENOENT) {
                continue;
            }

            ngx_log_error(NGX_LOG_CRIT, r->connection->log, of.err,
                          "%s \"%s\" failed", of.failed, path.data);

            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        uri.len = r->uri.len + len - 1;

        if (!clcf->alias) {
            uri.data = path.data + root;

        } else {
            uri.data = ngx_pnalloc(r->pool, uri.len);
            if (uri.data == NULL) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            p = ngx_copy(uri.data, r->uri.data, r->uri.len);
            ngx_memcpy(p, name, len - 1);
        }

        return ngx_http_internal_redirect(r, &uri, &r->args);
    }

    return NGX_DECLINED;
}